

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

bool __thiscall
Minisat::Solver::simplifyLearnt(Solver *this,vec<unsigned_int> *target_learnts,bool is_tier2)

{
  byte bVar1;
  uint *puVar2;
  ulong uVar3;
  lbool *plVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  CRef CVar10;
  ulong uVar11;
  anon_struct_8_10_eb538618_for_header aVar12;
  long lVar13;
  byte bVar14;
  undefined7 in_register_00000011;
  long lVar15;
  anon_struct_8_10_eb538618_for_header *paVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  CRef cr;
  uint local_64;
  ulong local_60;
  Solver *local_58;
  anon_struct_8_10_eb538618_for_header *local_50;
  vec<unsigned_int> *local_48;
  undefined4 local_3c;
  vec<unsigned_int> *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000011,is_tier2);
  iVar7 = target_learnts->sz;
  bVar6 = true;
  local_48 = target_learnts;
  if (iVar7 < 1) {
    local_60 = 0;
    uVar20 = 0;
  }
  else {
    local_38 = &this->learnts_core;
    iVar19 = 1;
    lVar15 = 4;
    uVar20 = 0;
    local_60 = 0;
    local_58 = this;
    do {
      local_64 = target_learnts->data[uVar20];
      puVar2 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
      uVar3 = *(ulong *)(puVar2 + local_64);
      if ((((uint)uVar3 & 3) != 1) && (uVar3 >> 0x22 != 1)) {
        if ((uVar3 & 0x100000000) == 0) {
          paVar16 = (anon_struct_8_10_eb538618_for_header *)(puVar2 + local_64);
          local_50 = paVar16;
          if (uVar3 < 0x400000000) {
            detachClause(this,local_64,true);
          }
          else {
            uVar11 = 0;
            bVar1 = 0;
            do {
              bVar5 = bVar1;
              iVar7 = *(int *)((long)&paVar16[1].field_0x0 + uVar11 * 4);
              bVar1 = (this->assigns).data[iVar7 >> 1].value;
              bVar14 = (byte)iVar7 & 1;
              if (bVar1 == bVar14) {
                removeSatisfiedClause(this,local_64,true);
                this = local_58;
                target_learnts = local_48;
                goto LAB_0011378b;
              }
              bVar6 = (bVar1 ^ bVar14) == 1;
              uVar11 = uVar11 + 1;
              bVar1 = bVar5 | bVar6;
            } while (uVar3 >> 0x22 != uVar11);
            detachClause(this,local_64,true);
            if ((bool)(bVar5 | bVar6)) {
              aVar12 = *local_50;
              if ((ulong)aVar12 < 0x400000000) {
                uVar17 = (ulong)aVar12 >> 0x22;
                iVar7 = 0;
              }
              else {
                plVar4 = (local_58->assigns).data;
                uVar11 = 0;
                iVar7 = 0;
                do {
                  iVar18 = *(int *)((long)&paVar16[1].field_0x0 + uVar11 * 4);
                  if (((byte)iVar18 & 1 ^ plVar4[iVar18 >> 1].value) != 1) {
                    lVar13 = (long)iVar7;
                    iVar7 = iVar7 + 1;
                    *(int *)((long)&local_50[1].field_0x0 + lVar13 * 4) = iVar18;
                    aVar12 = *local_50;
                  }
                  uVar11 = uVar11 + 1;
                  uVar17 = (ulong)aVar12 >> 0x22;
                } while (uVar11 < uVar17);
                iVar7 = (int)uVar11 - iVar7;
              }
              if (((ulong)aVar12 & 8) != 0) {
                *(undefined4 *)((long)&local_50[1].field_0x0 + (long)((int)uVar17 - iVar7) * 4) =
                     *(undefined4 *)((long)&local_50[1].field_0x0 + uVar17 * 4);
                aVar12 = *local_50;
              }
              *local_50 = (anon_struct_8_10_eb538618_for_header)
                          ((ulong)aVar12 & 0x3bfffffff |
                          (ulong)((aVar12._4_4_ >> 2) - iVar7) << 0x22);
            }
          }
          paVar16 = local_50;
          this = local_58;
          simplifyLearnt<Minisat::Clause>(local_58,(Clause *)local_50);
          bVar6 = isSimplifyDuplicate(this,local_64);
          if (bVar6) {
            removeSatisfiedClause(this,local_64,false);
            *paVar16 = (anon_struct_8_10_eb538618_for_header)
                       (((ulong)*paVar16 & 0xfffffffffffffffc) + 1);
            this->nr_lcm_duplicates = this->nr_lcm_duplicates + 1;
            target_learnts = local_48;
          }
          else {
            if ((uint)(uVar3 >> 0x22) != SUB84(*paVar16,4) >> 2) {
              shareViaCallback<Minisat::Clause>
                        (this,(Clause *)paVar16,(uint)((ulong)*paVar16 >> 5) & 0x1ffffff);
              this = local_58;
              paVar16 = local_50;
              if (local_58->drup_file != (FILE *)0x0) {
                binDRUP<Minisat::Clause>(local_58,'a',(Clause *)local_50,local_58->drup_file);
                this = local_58;
                paVar16 = local_50;
              }
            }
            target_learnts = local_48;
            iVar18 = (int)local_60;
            if ((ulong)*paVar16 >> 0x22 == 1) {
              uncheckedEnqueue(this,(Lit)*(int *)(paVar16 + 1),0,0xffffffff);
              *paVar16 = (anon_struct_8_10_eb538618_for_header)
                         (((ulong)*paVar16 & 0xfffffffffffffffc) + 1);
              CVar10 = propagate(this);
              if (CVar10 != 0xffffffff) {
                this->ok = false;
                uVar8 = (int)uVar20 + 1;
                uVar20 = (ulong)uVar8;
                iVar7 = local_48->sz;
                iVar18 = (int)local_60;
                if ((int)uVar8 < iVar7) {
                  puVar2 = local_48->data;
                  lVar13 = 0;
                  do {
                    puVar2[iVar18 + lVar13] = *(uint *)((long)puVar2 + lVar13 * 4 + lVar15);
                    iVar7 = local_48->sz;
                    lVar13 = lVar13 + 1;
                  } while (iVar19 + (int)lVar13 < iVar7);
                  goto LAB_001138d8;
                }
                goto LAB_001138e1;
              }
              uVar3 = *(ulong *)((this->ca).super_RegionAllocator<unsigned_int>.memory + local_64);
              uVar8 = (uint)(uVar3 >> 3) & 1;
              if ((uVar3 & 4) != 0) {
                uVar8 = 2;
              }
              (this->ca).super_RegionAllocator<unsigned_int>.wasted_ =
                   (uint)(uVar3 >> 0x22) + (this->ca).super_RegionAllocator<unsigned_int>.wasted_ +
                   uVar8 + 2;
              target_learnts = local_48;
            }
            else {
              if (SUB84(*paVar16,4) >> 2 == 0) {
                this->ok = false;
                uVar8 = (int)uVar20 + 1;
                uVar20 = (ulong)uVar8;
                iVar7 = local_48->sz;
                if ((int)uVar8 < iVar7) {
                  puVar2 = local_48->data;
                  lVar13 = 0;
                  do {
                    puVar2[iVar18 + lVar13] = *(uint *)((long)puVar2 + lVar13 * 4 + lVar15);
                    iVar7 = local_48->sz;
                    lVar13 = lVar13 + 1;
                  } while (iVar19 + (int)lVar13 < iVar7);
LAB_001138d8:
                  local_60 = (ulong)(uint)(iVar18 + (int)lVar13);
                  uVar20 = (ulong)(uint)(iVar19 + (int)lVar13);
                }
LAB_001138e1:
                bVar6 = false;
                goto LAB_0011383e;
              }
              attachClause(this,local_64);
              paVar16 = local_50;
              puVar2 = target_learnts->data;
              puVar2[iVar18] = puVar2[uVar20];
              if ((local_58->simplifyBuffer).ring.sz != 0) {
                (local_58->simplifyBuffer).ring.data[(local_58->simplifyBuffer).write_next] =
                     local_64;
                iVar7 = (local_58->simplifyBuffer).write_next + 1;
                if ((local_58->simplifyBuffer).ring.sz <= iVar7) {
                  iVar7 = 0;
                }
                (local_58->simplifyBuffer).write_next = iVar7;
              }
              uVar8 = computeLBD<Minisat::Clause>(local_58,(Clause *)local_50);
              aVar12 = *paVar16;
              if ((int)uVar8 < (int)((uint)((ulong)aVar12 >> 5) & 0x1ffffff)) {
                aVar12 = (anon_struct_8_10_eb538618_for_header)
                         ((ulong)aVar12 & 0xffffffffc000001f | (ulong)((uVar8 & 0x1ffffff) << 5));
                *paVar16 = aVar12;
              }
              uVar8 = (uint)local_60;
              uVar9 = uVar8 + 1;
              if (((char)local_3c != '\0') &&
                 ((int)((uint)((ulong)aVar12 >> 5) & 0x1ffffff) <= local_58->core_lbd_cut)) {
                vec<unsigned_int>::push(local_38,&local_64);
                aVar12 = (anon_struct_8_10_eb538618_for_header)((ulong)*local_50 | 3);
                paVar16 = local_50;
                uVar9 = uVar8;
              }
              *paVar16 = (anon_struct_8_10_eb538618_for_header)((ulong)aVar12 | 0x100000000);
              local_60 = (ulong)uVar9;
              this = local_58;
            }
          }
        }
        else {
          iVar7 = (int)local_60;
          local_60 = (ulong)(iVar7 + 1);
          target_learnts->data[iVar7] = local_64;
        }
      }
LAB_0011378b:
      uVar20 = uVar20 + 1;
      iVar7 = target_learnts->sz;
      iVar19 = iVar19 + 1;
      lVar15 = lVar15 + 4;
    } while ((long)uVar20 < (long)iVar7);
    bVar6 = true;
    local_48 = target_learnts;
  }
LAB_0011383e:
  iVar19 = (int)uVar20 - (int)local_60;
  if (iVar19 != 0 && (int)local_60 <= (int)uVar20) {
    local_48->sz = iVar7 - iVar19;
  }
  return bVar6;
}

Assistant:

bool Solver::simplifyLearnt(vec<CRef> &target_learnts, bool is_tier2)
{
    int ci, cj, li, lj;
    bool sat, false_lit;
    int nblevels;
    ////
    ////
    int nbSimplified = 0;
    int nbSimplifing = 0;

    bool ret = true;

    for (ci = 0, cj = 0; ci < target_learnts.size(); ci++) {
        CRef cr = target_learnts[ci];
        Clause &c = ca[cr];

        if (removed(cr) || c.size() == 1)
            continue;
        else if (c.simplified()) {
            target_learnts[cj++] = target_learnts[ci];
            ////
            nbSimplified++;
        } else {
            int saved_size = c.size();
            /* DRUP: in case we want a correct proof, i.e. track all simplifications,
               we would need to keep track of the original clause here. Let's skip this
               for efficiency. */
            //         if (drup_file){
            //                 add_oc.clear();
            //                 for (int i = 0; i < c.size(); i++) add_oc.push(c[i]); }
            ////
            nbSimplifing++;
            sat = false_lit = false;
            for (int i = 0; i < c.size(); i++) {
                if (value(c[i]) == l_True) {
                    sat = true;
                    break;
                } else if (value(c[i]) == l_False) {
                    false_lit = true;
                }
            }
            if (sat) {
                removeSatisfiedClause(cr);
            } else {
                detachClause(cr, true);

                if (false_lit) {
                    for (li = lj = 0; li < c.size(); li++) {
                        if (value(c[li]) != l_False) {
                            c[lj++] = c[li];
                        }
                    }
                    c.shrink(li - lj);
                    TRACE(std::cout << "c dropped" << li - lj << " literals from clause [" << cr << "]: " << c << std::endl);
                    c.S(0); // this clause might subsume others now
                }

                assert(c.size() > 1);
                // simplify a learnt clause c
                TRACE(std::cout << "c LCM simplify clause[" << cr << "]: " << c << std::endl);
                simplifyLearnt(c);

                bool recentDuplicate = isSimplifyDuplicate(cr);

                if (!recentDuplicate) {

                    TRACE(std::cout << "c LCM keep (simplified?) clause[" << cr << "]: " << c << std::endl);

                    if (saved_size != c.size()) {
                        shareViaCallback(c, c.lbd()); // share via IPASIR?

                        // print to proof
                        if (drup_file) {
#ifdef BIN_DRUP
                            binDRUP('a', c, drup_file);
                            //                    binDRUP('d', add_oc, drup_file);
#else
                            for (int i = 0; i < c.size(); i++)
                                fprintf(drup_file, "%i ", (var(c[i]) + 1) * (-2 * sign(c[i]) + 1));
                            fprintf(drup_file, "0\n");

                            //                    fprintf(drup_file, "d ");
                            //                    for (int i = 0; i < add_oc.size(); i++)
                            //                        fprintf(drup_file, "%i ", (var(add_oc[i]) + 1) * (-2 * sign(add_oc[i]) + 1));
                            //                    fprintf(drup_file, "0\n");
#endif
                        }
                    }

                    if (c.size() == 0) {
                        ok = false;
                        ret = false;
                        ci++;
                        while (ci < target_learnts.size()) target_learnts[cj++] = target_learnts[ci++];
                        goto simplifyLearnt_out;
                    } else if (c.size() == 1) {
                        // when unit clause occur, enqueue and propagate
                        uncheckedEnqueue(c[0], 0);
                        c.mark(1);
                        if (propagate() != CRef_Undef) {
                            ok = false;
                            ret = false;
                            ci++;
                            while (ci < target_learnts.size()) target_learnts[cj++] = target_learnts[ci++];
                            goto simplifyLearnt_out;
                        }
                        // delete the clause memory in logic
                        ca.free(cr);
                        /* DRUP: in case we want a correct proof, i.e. track all simplifications,
                        we would need to keep track of the original clause here. Let's skip this
                        for efficiency. */
                        //#ifdef BIN_DRUP
                        //                    binDRUP('d', c, drup_file);
                        //#else
                        //                    fprintf(drup_file, "d ");
                        //                    for (int i = 0; i < c.size(); i++)
                        //                        fprintf(drup_file, "%i ", (var(c[i]) + 1) * (-2 * sign(c[i]) + 1));
                        //                    fprintf(drup_file, "0\n");
                        //#endif
                    } else {
                        attachClause(cr);
                        target_learnts[cj++] = target_learnts[ci];
                        simplifyBuffer.addNext(cr); /* store in duplicate buffer */

                        nblevels = computeLBD(c);
                        if (nblevels < c.lbd()) {
                            c.set_lbd(nblevels);
                        }

                        // in case we work on the tier2 set, a clause might move to core learnt clauses
                        if (is_tier2 && c.lbd() <= core_lbd_cut) {
                            cj--;
                            learnts_core.push(cr);
                            c.mark(CORE);
                        }

                        c.setSimplified(true);
                    }

                } else {
                    TRACE(std::cout << "c LCM: drop duplicate simplified clause[" << cr << "]: " << ca[cr] << std::endl);
                    // this clause is a duplicate now, hence, mark it accordingly
                    /* DRUP: do not delete this simplified clause from the proof, as we did not add it yet */
                    removeSatisfiedClause(cr, false);
                    c.mark(1);
                    nr_lcm_duplicates++;
                }
            }
        }
    }
simplifyLearnt_out:;
    target_learnts.shrink(ci - cj);

    return ret;
}